

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void ARGB1555ToARGBRow_C(uint8 *src_argb1555,uint8 *dst_argb,int width)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  byte bVar4;
  
  if (0 < width) {
    lVar3 = 0;
    do {
      bVar1 = src_argb1555[lVar3 * 2];
      bVar2 = src_argb1555[lVar3 * 2 + 1];
      bVar4 = bVar2 * '\b' | bVar1 >> 5;
      dst_argb[lVar3 * 4] = bVar1 >> 2 & 7 | bVar1 * '\b';
      dst_argb[lVar3 * 4 + 1] = (bVar4 & 0x1c) >> 2 | bVar4 << 3;
      dst_argb[lVar3 * 4 + 2] = bVar2 >> 4 & 7 | bVar2 * '\x02' & 0xf8;
      dst_argb[lVar3 * 4 + 3] = (char)bVar2 >> 7;
      lVar3 = lVar3 + 1;
    } while (width != (int)lVar3);
  }
  return;
}

Assistant:

void ARGB1555ToARGBRow_C(const uint8* src_argb1555,
                         uint8* dst_argb,
                         int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8 b = src_argb1555[0] & 0x1f;
    uint8 g = (src_argb1555[0] >> 5) | ((src_argb1555[1] & 0x03) << 3);
    uint8 r = (src_argb1555[1] & 0x7c) >> 2;
    uint8 a = src_argb1555[1] >> 7;
    dst_argb[0] = (b << 3) | (b >> 2);
    dst_argb[1] = (g << 3) | (g >> 2);
    dst_argb[2] = (r << 3) | (r >> 2);
    dst_argb[3] = -a;
    dst_argb += 4;
    src_argb1555 += 2;
  }
}